

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::vector<bool,std::allocator<bool>>,void>
               (vector<bool,_std::allocator<bool>_> *container,ostream *os)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong *puVar6;
  bool bVar7;
  
  std::operator<<(os,'{');
  puVar6 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  uVar4 = 0;
  lVar5 = 0;
  while( true ) {
    if ((puVar6 == puVar2) && (uVar4 == uVar1)) {
      if (lVar5 == 0) goto LAB_001b13b7;
      goto LAB_001b13ac;
    }
    uVar3 = *puVar6;
    if ((lVar5 != 0) && (std::operator<<(os,','), lVar5 == 0x20)) break;
    std::operator<<(os,' ');
    PrintTo((1L << ((byte)uVar4 & 0x3f) & uVar3) != 0,os);
    lVar5 = lVar5 + 1;
    bVar7 = uVar4 == 0x3f;
    uVar4 = uVar4 + 1;
    puVar6 = puVar6 + bVar7;
    if (bVar7) {
      uVar4 = 0;
    }
  }
  std::operator<<(os," ...");
LAB_001b13ac:
  std::operator<<(os,' ');
LAB_001b13b7:
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }